

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

void __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::destroy_pipeline(ConvolutionDepthWise_x86_avx512 *this)

{
  Option *in_RSI;
  
  destroy_pipeline((ConvolutionDepthWise_x86_avx512 *)
                   ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 +
                   (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-7]),in_RSI);
  return;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}